

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_init_am(acmod_t *acmod)

{
  logmath_t *lmath;
  char *pcVar1;
  bin_mdef_t *pbVar2;
  tmat_t *ptVar3;
  ps_mgau_t *ppVar4;
  ps_mllr_t *mllr_00;
  double tpfloor;
  ps_mllr_t *mllr;
  char *hmmdir;
  char *mllrfn;
  char *tmatfn;
  char *mdeffn;
  acmod_t *acmod_local;
  
  pcVar1 = ps_config_str(acmod->config,"mdef");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = ps_config_str(acmod->config,"hmm");
    if (pcVar1 == (char *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
              ,0x46,
              "Acoustic model definition is not specified either with -mdef option or with -hmm\n");
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
              ,0x49,"Folder \'%s\' does not contain acoustic model definition \'mdef\'\n",pcVar1);
    }
    acmod_local._4_4_ = -1;
  }
  else {
    pbVar2 = bin_mdef_read(acmod->config,pcVar1);
    acmod->mdef = pbVar2;
    if (pbVar2 == (bin_mdef_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
              ,0x4f,"Failed to read acoustic model definition from %s\n",pcVar1);
      acmod_local._4_4_ = -1;
    }
    else {
      pcVar1 = ps_config_str(acmod->config,"tmat");
      if (pcVar1 == (char *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0x55,"No tmat file specified\n");
        acmod_local._4_4_ = -1;
      }
      else {
        lmath = acmod->lmath;
        tpfloor = ps_config_float(acmod->config,"tmatfloor");
        ptVar3 = tmat_init(pcVar1,lmath,(float64)tpfloor,1);
        acmod->tmat = ptVar3;
        pcVar1 = ps_config_str(acmod->config,"mean");
        if (((pcVar1 == (char *)0x0) ||
            (pcVar1 = ps_config_str(acmod->config,"var"), pcVar1 == (char *)0x0)) ||
           (pcVar1 = ps_config_str(acmod->config,"tmat"), pcVar1 == (char *)0x0)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x60,"No mean/var/tmat files specified\n");
          acmod_local._4_4_ = -1;
        }
        else {
          pcVar1 = ps_config_str(acmod->config,"senmgau");
          if (pcVar1 == (char *)0x0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                    ,0x6b,"Attempting to use PTM computation module\n");
            ppVar4 = ptm_mgau_init(acmod,acmod->mdef);
            acmod->mgau = ppVar4;
            if (ppVar4 == (ps_mgau_t *)0x0) {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                      ,0x6d,"Attempting to use semi-continuous computation module\n");
              ppVar4 = s2_semi_mgau_init(acmod);
              acmod->mgau = ppVar4;
              if (ppVar4 == (ps_mgau_t *)0x0) {
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                        ,0x6f,"Falling back to general multi-stream GMM computation\n");
                ppVar4 = ms_mgau_init(acmod,acmod->lmath,acmod->mdef);
                acmod->mgau = ppVar4;
                if (acmod->mgau == (ps_mgau_t *)0x0) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                          ,0x72,"Failed to read acoustic model\n");
                  return -1;
                }
              }
            }
          }
          else {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                    ,0x65,"Using general multi-stream GMM computation\n");
            ppVar4 = ms_mgau_init(acmod,acmod->lmath,acmod->mdef);
            acmod->mgau = ppVar4;
            if (acmod->mgau == (ps_mgau_t *)0x0) {
              return -1;
            }
          }
          pcVar1 = ps_config_str(acmod->config,"mllr");
          if (pcVar1 != (char *)0x0) {
            mllr_00 = ps_mllr_read(pcVar1);
            if (mllr_00 == (ps_mllr_t *)0x0) {
              return -1;
            }
            acmod_update_mllr(acmod,mllr_00);
          }
          acmod_local._4_4_ = 0;
        }
      }
    }
  }
  return acmod_local._4_4_;
}

Assistant:

static int
acmod_init_am(acmod_t *acmod)
{
    char const *mdeffn, *tmatfn, *mllrfn, *hmmdir;

    /* Read model definition. */
    if ((mdeffn = ps_config_str(acmod->config, "mdef")) == NULL) {
        if ((hmmdir = ps_config_str(acmod->config, "hmm")) == NULL)
            E_ERROR("Acoustic model definition is not specified either "
                    "with -mdef option or with -hmm\n");
        else
            E_ERROR("Folder '%s' does not contain acoustic model "
                    "definition 'mdef'\n", hmmdir);

        return -1;
    }

    if ((acmod->mdef = bin_mdef_read(acmod->config, mdeffn)) == NULL) {
        E_ERROR("Failed to read acoustic model definition from %s\n", mdeffn);
        return -1;
    }

    /* Read transition matrices. */
    if ((tmatfn = ps_config_str(acmod->config, "tmat")) == NULL) {
        E_ERROR("No tmat file specified\n");
        return -1;
    }
    acmod->tmat = tmat_init(tmatfn, acmod->lmath,
                            ps_config_float(acmod->config, "tmatfloor"),
                            TRUE);

    /* Read the acoustic models. */
    if ((ps_config_str(acmod->config, "mean") == NULL)
        || (ps_config_str(acmod->config, "var") == NULL)
        || (ps_config_str(acmod->config, "tmat") == NULL)) {
        E_ERROR("No mean/var/tmat files specified\n");
        return -1;
    }

    if (ps_config_str(acmod->config, "senmgau")) {
        E_INFO("Using general multi-stream GMM computation\n");
        acmod->mgau = ms_mgau_init(acmod, acmod->lmath, acmod->mdef);
        if (acmod->mgau == NULL)
            return -1;
    }
    else {
        E_INFO("Attempting to use PTM computation module\n");
        if ((acmod->mgau = ptm_mgau_init(acmod, acmod->mdef)) == NULL) {
            E_INFO("Attempting to use semi-continuous computation module\n");
            if ((acmod->mgau = s2_semi_mgau_init(acmod)) == NULL) {
                E_INFO("Falling back to general multi-stream GMM computation\n");
                acmod->mgau = ms_mgau_init(acmod, acmod->lmath, acmod->mdef);
                if (acmod->mgau == NULL) {
                    E_ERROR("Failed to read acoustic model\n");
                    return -1;
                }
            }
        }
    }

    /* If there is an MLLR transform, apply it. */
    if ((mllrfn = ps_config_str(acmod->config, "mllr"))) {
        ps_mllr_t *mllr = ps_mllr_read(mllrfn);
        if (mllr == NULL)
            return -1;
        acmod_update_mllr(acmod, mllr);
    }

    return 0;
}